

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void xmrig::HttpClient::onConnect(uv_connect_t *req,int status)

{
  _Rb_tree_color _Var1;
  String *this;
  char *pcVar2;
  undefined8 uVar3;
  uv_stream_t *puVar4;
  _func_void_uv_handle_t_ptr_size_t_uv_buf_t_ptr *p_Var5;
  _func_void_uv_stream_t_ptr_ssize_t_uv_buf_t_ptr *p_Var6;
  int in_ESI;
  undefined8 *in_RDI;
  HttpClient *client;
  __1 local_1a;
  __0 local_19;
  HttpContext *local_18;
  int local_c;
  undefined8 *local_8;
  
  local_18 = (HttpContext *)*in_RDI;
  if (local_18 == (HttpContext *)0x0) {
    if (in_RDI != (undefined8 *)0x0) {
      operator_delete(in_RDI);
    }
  }
  else if (in_ESI < 0) {
    local_c = in_ESI;
    local_8 = in_RDI;
    if ((local_18[1].super_HttpData.method & 1) == 0) {
      this = Dns::host(*(Dns **)&local_18[1].super_HttpData.headers._M_t._M_impl);
      pcVar2 = String::data(this);
      _Var1 = local_18[1].super_HttpData.headers._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_color;
      uVar3 = uv_strerror(local_c);
      Log::print(ERR,"[%s:%d] connect error: \"%s\"",pcVar2,(ulong)(ushort)(short)_Var1,uVar3);
    }
    if (local_8 != (undefined8 *)0x0) {
      operator_delete(local_8);
    }
    HttpContext::close(local_18,local_c);
  }
  else {
    puVar4 = HttpContext::stream(local_18);
    p_Var5 = onConnect(uv_connect_s*,int)::$_0::operator_cast_to_function_pointer(&local_19);
    p_Var6 = onConnect(uv_connect_s*,int)::$_1::operator_cast_to_function_pointer(&local_1a);
    uv_read_start(puVar4,p_Var5,p_Var6);
    (*local_18->_vptr_HttpContext[3])();
  }
  return;
}

Assistant:

void xmrig::HttpClient::onConnect(uv_connect_t *req, int status)
{
    auto client = static_cast<HttpClient *>(req->data);
    if (!client) {
        delete req;
        return;
    }

    if (status < 0) {
        if (!client->m_quiet) {
            LOG_ERR("[%s:%d] connect error: \"%s\"", client->m_dns->host().data(), client->m_port, uv_strerror(status));
        }

        delete req;
        client->close(status);
        return;
    }

    uv_read_start(client->stream(),
        [](uv_handle_t *, size_t suggested_size, uv_buf_t *buf)
        {
            buf->base = new char[suggested_size];

#           ifdef _WIN32
            buf->len = static_cast<unsigned int>(suggested_size);
#           else
            buf->len = suggested_size;
#           endif
        },
        [](uv_stream_t *tcp, ssize_t nread, const uv_buf_t *buf)
        {
            auto client = static_cast<HttpClient*>(tcp->data);

            if (nread >= 0) {
                client->read(buf->base, static_cast<size_t>(nread));
            } else {
                if (!client->m_quiet && nread != UV_EOF) {
                    LOG_ERR("[%s:%d] read error: \"%s\"", client->m_dns->host().data(), client->m_port, uv_strerror(static_cast<int>(nread)));
                }

                client->close(static_cast<int>(nread));
            }

            delete [] buf->base;
        });

    client->handshake();
}